

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_avsd_api.c
# Opt level: O1

MPP_RET hal_avsd_gen_regs(void *decoder,HalTaskInfo *task)

{
  MPP_RET MVar1;
  char *fmt;
  MppCodingType coding;
  
  memcpy((void *)((long)decoder + 0x90),(task->dec).syntax.data,0x110);
  coding = MPP_VIDEO_CodingAVSPLUS;
  if (*(int *)((long)decoder + 0x90) != 0x48) {
    coding = *(MppCodingType *)((long)decoder + 0x70);
  }
  if (coding != *(MppCodingType *)((long)decoder + 0x70)) {
    if (*(MppDev *)((long)decoder + 0x80) != (MppDev)0x0) {
      MVar1 = mpp_dev_deinit(*(MppDev *)((long)decoder + 0x80));
      if (MVar1 != MPP_OK) {
        _mpp_log_l(2,"hal_avsd_api","mpp_dev_deinit failed. ret: %d\n",(char *)0x0,
                   (ulong)(uint)MVar1);
      }
      *(undefined8 *)((long)decoder + 0x80) = 0;
    }
    MVar1 = (**(code **)((long)decoder + 0x20))(decoder);
    if (MVar1 == MPP_OK) {
      MVar1 = init_hard_platform((AvsdHalCtx_t *)decoder,coding);
      if (MVar1 != MPP_OK) {
        _mpp_log_l(2,"hal_avsd_api","change paltform %x -> %x error\n","hal_avsd_gen_regs",
                   (ulong)*(uint *)((long)decoder + 0x70),(ulong)coding);
        return MVar1;
      }
      MVar1 = (**(code **)((long)decoder + 0x18))(decoder,*(undefined8 *)((long)decoder + 0x1b8));
      if (MVar1 == MPP_OK) goto LAB_001e2f3e;
      fmt = "init decoder failed, ret %d\n";
    }
    else {
      fmt = "deinit decoder failed, ret %d\n";
    }
    _mpp_log_l(2,"hal_avsd_api",fmt,"hal_avsd_gen_regs",(ulong)(uint)MVar1);
    return MVar1;
  }
LAB_001e2f3e:
  *(int *)((long)decoder + 0x21c) = *(int *)((long)decoder + 0x21c) + 1;
  MVar1 = (**(code **)((long)decoder + 0x28))(decoder,task);
  return MVar1;
}

Assistant:

MPP_RET hal_avsd_gen_regs(void *decoder, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    MppCodingType coding = MPP_VIDEO_CodingUnused;
    AvsdHalCtx_t *p_hal = (AvsdHalCtx_t *)decoder;

    memcpy(&p_hal->syn, task->dec.syntax.data, sizeof(AvsdSyntax_t));
    // check coding
    coding = (p_hal->syn.pp.profileId == 0x48) ? MPP_VIDEO_CodingAVSPLUS : p_hal->coding;
    if (coding != p_hal->coding) {
        if (p_hal->dev) {
            ret = mpp_dev_deinit(p_hal->dev);
            if (ret)
                mpp_err("mpp_dev_deinit failed. ret: %d\n", ret);

            p_hal->dev = NULL;
        }

        ret = p_hal->hal_api.deinit(decoder);
        if (ret) {
            mpp_err_f("deinit decoder failed, ret %d\n", ret);
            return ret;
        }

        ret = init_hard_platform(p_hal, coding);
        if (ret) {
            mpp_err_f("change paltform %x -> %x error\n", p_hal->coding, coding);
            return ret;
        }

        ret = p_hal->hal_api.init(decoder, p_hal->cfg);
        if (ret) {
            mpp_err_f("init decoder failed, ret %d\n", ret);
            return ret;
        }
    }

    p_hal->frame_no++;

    return p_hal->hal_api.reg_gen(decoder, task);
}